

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

EmptyMemberSymbol *
slang::ast::EmptyMemberSymbol::fromSyntax
          (Compilation *compilation,Scope *scope,EmptyMemberSyntax *syntax)

{
  EmptyMemberSyntax *pEVar1;
  bool bVar2;
  Symbol *this;
  iterator pTVar3;
  SourceRange sourceRange;
  Trivia trivia;
  iterator __end3;
  iterator __begin3;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_60;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> *local_50;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> *__range3;
  undefined1 auStack_40 [7];
  bool anySkipped;
  SourceLocation local_30;
  Symbol *local_28;
  EmptyMemberSymbol *result;
  EmptyMemberSyntax *syntax_local;
  Scope *scope_local;
  Compilation *compilation_local;
  
  result = (EmptyMemberSymbol *)syntax;
  syntax_local = (EmptyMemberSyntax *)scope;
  scope_local = (Scope *)compilation;
  local_30 = parsing::Token::location(&syntax->semi);
  this = &BumpAllocator::emplace<slang::ast::EmptyMemberSymbol,slang::SourceLocation>
                    (&compilation->super_BumpAllocator,&local_30)->super_Symbol;
  pEVar1 = syntax_local;
  local_28 = this;
  _auStack_40 = slang::syntax::SyntaxList::operator_cast_to_span
                          ((SyntaxList *)&(result->super_Symbol).name._M_str);
  Symbol::setAttributes(this,(Scope *)pEVar1,_auStack_40);
  bVar2 = nonstd::span_lite::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
          ::empty((span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *)
                  &(result->super_Symbol).indexInScope);
  if ((bVar2) &&
     (bVar2 = parsing::Token::isMissing((Token *)&result[1].super_Symbol.indexInScope), !bVar2)) {
    __range3._7_1_ = 0;
    ___begin3 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)result);
    local_60 = parsing::Token::trivia((Token *)&__begin3);
    local_50 = &local_60;
    __end3 = nonstd::span_lite::span<const_slang::parsing::Trivia,_18446744073709551615UL>::begin
                       (local_50);
    pTVar3 = nonstd::span_lite::span<const_slang::parsing::Trivia,_18446744073709551615UL>::end
                       (local_50);
    pEVar1 = syntax_local;
    for (; __end3 != pTVar3; __end3 = __end3 + 1) {
      trivia.field_0._5_1_ =
           (undefined1)((ulong)*(undefined8 *)((long)&__end3->field_0 + 8) >> 0x28);
      if (trivia.field_0._5_1_ == '\x06') {
        __range3._7_1_ = 1;
        break;
      }
    }
    if ((__range3._7_1_ & 1) == 0) {
      sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)result);
      Scope::addDiag((Scope *)pEVar1,(DiagCode)0xac0006,sourceRange);
    }
  }
  return (EmptyMemberSymbol *)local_28;
}

Assistant:

EmptyMemberSymbol& EmptyMemberSymbol::fromSyntax(Compilation& compilation, const Scope& scope,
                                                 const EmptyMemberSyntax& syntax) {
    auto result = compilation.emplace<EmptyMemberSymbol>(syntax.semi.location());
    result->setAttributes(scope, syntax.attributes);

    // Report a warning if this is just an empty semicolon hanging out for no reason,
    // but don't report if this was inserted due to an error elsewhere.
    if (syntax.attributes.empty() && !syntax.semi.isMissing()) {
        // If there are skipped nodes behind this semicolon don't report the warning,
        // as it's likely it's due to the error itself.
        bool anySkipped = false;
        for (auto trivia : syntax.getFirstToken().trivia()) {
            if (trivia.kind == TriviaKind::SkippedTokens) {
                anySkipped = true;
                break;
            }
        }

        if (!anySkipped)
            scope.addDiag(diag::EmptyMember, syntax.sourceRange());
    }

    return *result;
}